

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawFuzzColumnPalCommand::Execute(DrawFuzzColumnPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint8_t *puVar2;
  ulong uVar3;
  BYTE *pBVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint first_line;
  BYTE *pBVar10;
  BYTE *pBVar11;
  int *piVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  
  uVar14 = *(uint *)&(this->super_DrawerCommand).field_0xc;
  first_line = 1;
  if (1 < (int)uVar14) {
    first_line = uVar14;
  }
  iVar5 = this->_fuzzviewheight;
  if (this->_yh < this->_fuzzviewheight) {
    iVar5 = this->_yh;
  }
  iVar5 = DrawerThread::count_for_thread(thread,first_line,(iVar5 - first_line) + 1);
  pBVar4 = NormalLight.Maps;
  if (0 < iVar5) {
    iVar1 = this->_pitch;
    iVar8 = (&ylookup)[first_line];
    iVar7 = this->_x;
    puVar2 = this->_destorg;
    iVar6 = DrawerThread::skipped_by_thread(thread,first_line);
    pBVar10 = puVar2 + (long)iVar6 * (long)iVar1 + (long)iVar7 + (long)iVar8;
    iVar1 = thread->num_cores;
    lVar16 = (long)iVar1;
    lVar13 = this->_pitch * lVar16;
    iVar8 = this->_fuzzpos;
    iVar7 = DrawerThread::skipped_by_thread(thread,first_line);
    uVar3 = (long)(iVar7 + iVar8) % 0x32;
    iVar8 = DrawerThread::skipped_by_thread(thread,first_line);
    pBVar11 = pBVar10;
    if ((int)(iVar8 + first_line) < iVar1) {
      pBVar11 = pBVar10 + lVar13;
      *pBVar10 = pBVar4[(ulong)pBVar11[(int)(&fuzzoffset)[(int)uVar3] * lVar16] + 0x600];
      uVar3 = (long)(iVar1 + (int)uVar3) % 0x32;
      iVar5 = iVar5 + -1;
      if (iVar5 == 0) {
        return;
      }
    }
    iVar7 = (iVar1 + iVar5 + -1) * iVar1 + iVar8 + first_line;
    iVar8 = this->_fuzzviewheight;
    iVar5 = iVar5 - (uint)(iVar8 < iVar7);
    while( true ) {
      uVar15 = uVar3 & 0xffffffff;
      iVar6 = (int)uVar3;
      if (iVar5 < 1) break;
      iVar9 = ((0x32 - iVar6) / iVar1 + 1) - (uint)((0x32 - iVar6) % iVar1 == 0);
      if (iVar5 < iVar9) {
        iVar9 = iVar5;
      }
      piVar12 = &fuzzoffset + iVar6;
      iVar6 = iVar9;
      do {
        *pBVar11 = pBVar4[(ulong)pBVar11[*piVar12 * lVar16] + 0x600];
        pBVar11 = pBVar11 + lVar13;
        piVar12 = piVar12 + lVar16;
        uVar14 = (int)uVar15 + iVar1;
        uVar15 = (ulong)uVar14;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      iVar5 = iVar5 - iVar9;
      uVar3 = (long)(int)uVar14 % 0x32;
    }
    if (iVar8 < iVar7) {
      *pBVar11 = pBVar4[(ulong)pBVar11[(int)(&fuzzoffset)[iVar6] * lVar16 - lVar13] + 0x600];
    }
  }
  return;
}

Assistant:

void DrawFuzzColumnPalCommand::Execute(DrawerThread *thread)
	{
		int yl = MAX(_yl, 1);
		int yh = MIN(_yh, _fuzzviewheight);

		int count = thread->count_for_thread(yl, yh - yl + 1);

		// Zero length.
		if (count <= 0)
			return;

		uint8_t *map = &NormalLight.Maps[6 * 256];

		uint8_t *dest = thread->dest_for_thread(yl, _pitch, ylookup[yl] + _x + _destorg);

		int pitch = _pitch * thread->num_cores;
		int fuzzstep = thread->num_cores;
		int fuzz = (_fuzzpos + thread->skipped_by_thread(yl)) % FUZZTABLE;

		yl += thread->skipped_by_thread(yl);

		// Handle the case where we would go out of bounds at the top:
		if (yl < fuzzstep)
		{
			uint8_t *srcdest = dest + fuzzoffset[fuzz] * fuzzstep + pitch;
			//assert(static_cast<int>((srcdest - (uint8_t*)dc_destorg) / (_pitch)) < viewheight);

			*dest = map[*srcdest];
			dest += pitch;
			fuzz += fuzzstep;
			fuzz %= FUZZTABLE;

			count--;
			if (count == 0)
				return;
		}

		bool lowerbounds = (yl + (count + fuzzstep - 1) * fuzzstep > _fuzzviewheight);
		if (lowerbounds)
			count--;

		// Fuzz where fuzzoffset stays within bounds
		while (count > 0)
		{
			int available = (FUZZTABLE - fuzz);
			int next_wrap = available / fuzzstep;
			if (available % fuzzstep != 0)
				next_wrap++;

			int cnt = MIN(count, next_wrap);
			count -= cnt;
			do
			{
				uint8_t *srcdest = dest + fuzzoffset[fuzz] * fuzzstep;
				//assert(static_cast<int>((srcdest - (uint8_t*)dc_destorg) / (_pitch)) < viewheight);

				*dest = map[*srcdest];
				dest += pitch;
				fuzz += fuzzstep;
			} while (--cnt);

			fuzz %= FUZZTABLE;
		}

		// Handle the case where we would go out of bounds at the bottom
		if (lowerbounds)
		{
			uint8_t *srcdest = dest + fuzzoffset[fuzz] * fuzzstep - pitch;
			//assert(static_cast<int>((srcdest - (uint8_t*)dc_destorg) / (_pitch)) < viewheight);

			*dest = map[*srcdest];
		}
	}